

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_diag.c
# Opt level: O0

int CVDiagSolve(CVodeMem cv_mem,N_Vector b,N_Vector weight,N_Vector ycur,N_Vector fcur)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  int iVar4;
  undefined8 in_RSI;
  long in_RDI;
  CVDiagMem cvdiag_mem;
  sunrealtype r;
  int invOK;
  
  pdVar3 = *(double **)(in_RDI + 0x410);
  if ((*pdVar3 != *(double *)(in_RDI + 0x288)) || (NAN(*pdVar3) || NAN(*(double *)(in_RDI + 0x288)))
     ) {
    dVar1 = *(double *)(in_RDI + 0x288);
    dVar2 = *pdVar3;
    N_VInv(pdVar3[1],pdVar3[1]);
    N_VAddConst(0xbff0000000000000,pdVar3[1],pdVar3[1]);
    N_VScale(dVar1 / dVar2,pdVar3[1],pdVar3[1]);
    N_VAddConst(0x3ff0000000000000,pdVar3[1],pdVar3[1]);
    iVar4 = N_VInvTest(pdVar3[1],pdVar3[1]);
    if (iVar4 == 0) {
      pdVar3[5] = -NAN;
      return 1;
    }
    *pdVar3 = *(double *)(in_RDI + 0x288);
  }
  N_VProd(in_RSI,pdVar3[1],in_RSI);
  pdVar3[5] = 0.0;
  return 0;
}

Assistant:

static int CVDiagSolve(CVodeMem cv_mem, N_Vector b,
                       SUNDIALS_MAYBE_UNUSED N_Vector weight,
                       SUNDIALS_MAYBE_UNUSED N_Vector ycur,
                       SUNDIALS_MAYBE_UNUSED N_Vector fcur)
{
  sunbooleantype invOK;
  sunrealtype r;
  CVDiagMem cvdiag_mem;

  cvdiag_mem = (CVDiagMem)lmem;

  /* If gamma has changed, update factor in M, and save gamma value */

  if (gammasv != gamma)
  {
    r = gamma / gammasv;
#ifdef SUNDIALS_BUILD_PACKAGE_FUSED_KERNELS
    if (cv_mem->cv_usefused) { cvDiagSolve_updateM(r, M); }
    else
#endif
    {
      N_VInv(M, M);
      N_VAddConst(M, -ONE, M);
      N_VScale(r, M, M);
      N_VAddConst(M, ONE, M);
    }
    invOK = N_VInvTest(M, M);
    if (!invOK)
    {
      last_flag = CVDIAG_INV_FAIL;
      return (1);
    }
    gammasv = gamma;
  }

  /* Apply M-inverse to b */
  N_VProd(b, M, b);

  last_flag = CVDIAG_SUCCESS;
  return (0);
}